

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolve.cpp
# Opt level: O0

Matrix * __thiscall TriangularSolve::solve(TriangularSolve *this,Matrix *L,Matrix *d,int dia)

{
  int row;
  Matrix *this_00;
  int local_84;
  int local_80;
  int j_1;
  int j;
  int i;
  int d1;
  int c;
  double s;
  allocator local_51;
  string local_50;
  Matrix *y;
  Matrix *pMStack_20;
  int dia_local;
  Matrix *d_local;
  Matrix *L_local;
  TriangularSolve *this_local;
  
  y._4_4_ = dia;
  pMStack_20 = d;
  d_local = L;
  L_local = (Matrix *)this;
  this_00 = (Matrix *)operator_new(0x30);
  row = this->rowNo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"y(Unknowns):",&local_51);
  Matrix::Matrix(this_00,row,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  j_1 = 0;
  while( true ) {
    j = y._4_4_ / 2;
    _d1 = 0.0;
    if (this->rowNo <= j_1) break;
    if (j_1 <= j) {
      for (local_80 = 0; local_80 < j_1; local_80 = local_80 + 1) {
        _d1 = d_local->array[j_1][local_80] * *this_00->array[local_80] + _d1;
      }
      *this_00->array[j_1] = (*pMStack_20->array[j_1] - _d1) / d_local->array[j_1][j_1];
    }
    local_84 = j_1;
    if (j < j_1) {
      while (local_84 = local_84 + -1, local_84 - j < local_84) {
        j = j + -1;
        _d1 = d_local->array[j_1][j] * *this_00->array[local_84] + _d1;
      }
      *this_00->array[j_1] = (*pMStack_20->array[j_1] - _d1) / d_local->array[j_1][y._4_4_ / 2];
    }
    j_1 = j_1 + 1;
  }
  return this_00;
}

Assistant:

Matrix* TriangularSolve::solve(Matrix *L, Matrix *d, int dia)
{
    Matrix *y = new Matrix(rowNo, 1, "y(Unknowns):");
    double s = 0;
    int c=0;
    int d1 = dia/2;

    for(int i=0; i<rowNo; i++)
    {
        if(i<=d1)
        {
            for(int j=0; j<i ; j++)
            {
               s += L->array[i][j]*y->array[j][0];
            }
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][i];

        }
         if(i>d1)
        {
            for (int j = i-1; j > j-d1; j--)
            {
                d1--;
                s += L->array[i][d1]*y->array[j][0];
            }
          d1=dia/2;
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][d1];
        }

        s = 0;
    }
    return y;
}